

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall BaseSocketImpl::StartClosingCB(BaseSocketImpl *this)

{
  mutex *__mutex;
  _Invoker_type p_Var1;
  _Invoker_type p_Var2;
  int iVar3;
  _func_bool__Any_data_ptr__Any_data_ptr__Manager_operation *__tmp;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  BaseSocket *local_30;
  void *local_28;
  
  __mutex = &this->m_mxFnClosing;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  local_48 = (this->m_fClosingParam).super__Function_base._M_manager;
  if (local_48 == (_Manager_type)0x0) {
    local_48 = (this->m_fClosing).super__Function_base._M_manager;
    if (local_48 == (_Manager_type)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosing).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosing).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosing).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var2 = (this->m_fClosing)._M_invoker;
    (this->m_fClosing)._M_invoker = (_Invoker_type)0x0;
    local_40 = (_Invoker_type)p_Var2;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_30 = this->m_pBkRef;
    (*p_Var2)(&local_58,&local_30);
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  else {
    local_58._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor;
    local_58._8_8_ =
         *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->m_fClosingParam).super__Function_base._M_functor = 0;
    *(undefined8 *)((long)&(this->m_fClosingParam).super__Function_base._M_functor + 8) = 0;
    (this->m_fClosingParam).super__Function_base._M_manager = (_Manager_type)0x0;
    p_Var1 = (this->m_fClosingParam)._M_invoker;
    (this->m_fClosingParam)._M_invoker = (_Invoker_type)0x0;
    local_40 = p_Var1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_28 = this->m_pvUserData;
    local_30 = this->m_pBkRef;
    (*p_Var1)(&local_58,&local_30,&local_28);
    if (local_48 != (_Manager_type)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
  }
  return;
}

Assistant:

void BaseSocketImpl::StartClosingCB()
{
    m_mxFnClosing.lock();
    if (m_fClosingParam)
    {
        function<void(BaseSocket*, void*)> tmpfun;
        m_fClosingParam.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef, m_pvUserData);
    }
    else if (m_fClosing)
    {
        function<void(BaseSocket*)> tmpfun;
        m_fClosing.swap(tmpfun);
        m_mxFnClosing.unlock();
        tmpfun(m_pBkRef);
    }
    else
        m_mxFnClosing.unlock();
}